

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall BotscriptParser::BotscriptParser(BotscriptParser *this)

{
  DataBuffer *pDVar1;
  Lexer *this_00;
  
  this->m_isReadOnly = false;
  pDVar1 = (DataBuffer *)operator_new(0xb8);
  DataBuffer::DataBuffer(pDVar1,0x80);
  this->m_mainBuffer = pDVar1;
  pDVar1 = (DataBuffer *)operator_new(0xb8);
  DataBuffer::DataBuffer(pDVar1,0x80);
  this->m_onenterBuffer = pDVar1;
  pDVar1 = (DataBuffer *)operator_new(0xb8);
  DataBuffer::DataBuffer(pDVar1,0x80);
  this->m_mainLoopBuffer = pDVar1;
  this->m_switchBuffer = (DataBuffer *)0x0;
  this_00 = (Lexer *)operator_new(0x70);
  Lexer::Lexer(this_00);
  this->m_lexer = this_00;
  this->m_numStates = 0;
  this->m_numEvents = 0;
  this->m_currentMode = TopLevel;
  (this->m_currentState)._string._M_dataplus._M_p = (pointer)&(this->m_currentState)._string.field_2
  ;
  (this->m_currentState)._string._M_string_length = 0;
  (this->m_currentState)._string.field_2._M_local_buf[0] = '\0';
  this->m_isStateSpawnDefined = false;
  this->m_gotMainLoop = false;
  this->m_scopeCursor = -1;
  this->m_isElseAllowed = false;
  this->m_highestGlobalVarIndex = 0;
  this->m_highestStateVarIndex = 0;
  (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>::_M_initialize_map
            ((_Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_> *)&this->m_scopeStack,0);
  return;
}

Assistant:

BotscriptParser::BotscriptParser() :
	m_isReadOnly (false),
	m_mainBuffer (new DataBuffer),
	m_onenterBuffer (new DataBuffer),
	m_mainLoopBuffer (new DataBuffer),
	m_switchBuffer (nullptr),
	m_lexer (new Lexer),
	m_numStates (0),
	m_numEvents (0),
	m_currentMode (ParserMode::TopLevel),
	m_isStateSpawnDefined (false),
	m_gotMainLoop (false),
	m_scopeCursor (-1),
	m_isElseAllowed (false),
	m_highestGlobalVarIndex (0),
	m_highestStateVarIndex (0) {}